

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

bool deqp::egl::SurfaceConfig::compareColorBufferBits
               (SurfaceConfig *a,SurfaceConfig *b,BVec4 *specifiedRGBColors,
               BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  IVec4 mask;
  Vector<bool,_4> local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  dVar1 = (a->m_info).colorBufferType;
  if (dVar1 == 0x3300) {
    bVar5 = (b->m_info).yuvPlaneBpp < (a->m_info).yuvPlaneBpp && yuvPlaneBppSpecified;
  }
  else {
    if (dVar1 == 0x308f) {
      tcu::Vector<bool,_2>::cast<int>(specifiedLuminanceColors);
      iVar4 = (a->m_info).alphaSize * local_24 + (a->m_info).luminanceSize * (int)local_28.m_data;
      iVar3 = local_24 * (b->m_info).alphaSize + (int)local_28.m_data * (b->m_info).luminanceSize;
      bVar6 = SBORROW4(iVar4,iVar3);
      iVar2 = iVar4 - iVar3;
      bVar5 = iVar4 == iVar3;
    }
    else {
      if (dVar1 != 0x308e) {
        return true;
      }
      tcu::Vector<bool,_4>::cast<int>(&local_28);
      iVar4 = (a->m_info).alphaSize * local_1c + (a->m_info).blueSize * local_20 +
              (a->m_info).greenSize * local_24 + (a->m_info).redSize * (int)local_28.m_data;
      iVar3 = local_1c * (b->m_info).alphaSize + local_20 * (b->m_info).blueSize +
              local_24 * (b->m_info).greenSize + (int)local_28.m_data * (b->m_info).redSize;
      bVar6 = SBORROW4(iVar4,iVar3);
      iVar2 = iVar4 - iVar3;
      bVar5 = iVar4 == iVar3;
    }
    bVar5 = !bVar5 && bVar6 == iVar2 < 0;
  }
  return bVar5;
}

Assistant:

static bool compareColorBufferBits (const SurfaceConfig& a, const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified)
	{
		DE_ASSERT(a.m_info.colorBufferType == b.m_info.colorBufferType);
		switch (a.m_info.colorBufferType)
		{
			case EGL_RGB_BUFFER:
			{
				const tcu::IVec4	mask	(specifiedRGBColors.cast<deInt32>());

				return (a.m_info.redSize * mask[0] + a.m_info.greenSize * mask[1] + a.m_info.blueSize * mask[2] + a.m_info.alphaSize * mask[3])
						> (b.m_info.redSize * mask[0] + b.m_info.greenSize * mask[1] + b.m_info.blueSize * mask[2] + b.m_info.alphaSize * mask[3]);
			}

			case EGL_LUMINANCE_BUFFER:
			{
				const tcu::IVec2	mask	(specifiedLuminanceColors.cast<deInt32>());

				return (a.m_info.luminanceSize * mask[0] + a.m_info.alphaSize * mask[1]) > (b.m_info.luminanceSize * mask[0] + b.m_info.alphaSize * mask[1]);
			}

			case EGL_YUV_BUFFER_EXT:
				return yuvPlaneBppSpecified ? (a.m_info.yuvPlaneBpp > b.m_info.yuvPlaneBpp) : false;

			default:
				DE_ASSERT(DE_FALSE);
				return true;
		}
	}